

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t HUF_decompress1X1_DCtx_wksp
                 (HUF_DTable *dctx,void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,
                 void *workSpace,size_t wkspSize,int flags)

{
  uint uVar1;
  void *in_RCX;
  HUF_DTable *in_R8;
  void *in_R9;
  size_t hSize;
  BYTE *ip;
  int in_stack_00000084;
  size_t in_stack_00000088;
  void *in_stack_00000090;
  size_t in_stack_00000098;
  void *in_stack_000000a0;
  HUF_DTable *in_stack_000000a8;
  void *dst_00;
  undefined8 local_8;
  
  dst_00 = in_RCX;
  local_8 = (HUF_DTable *)
            HUF_readDTableX1_wksp
                      (in_stack_000000a8,in_stack_000000a0,in_stack_00000098,in_stack_00000090,
                       in_stack_00000088,in_stack_00000084);
  uVar1 = ERR_isError((size_t)local_8);
  if (uVar1 == 0) {
    if (local_8 < in_R8) {
      local_8 = (HUF_DTable *)
                HUF_decompress1X1_usingDTable_internal
                          (dst_00,(long)in_R8 - (long)local_8,in_R9,(long)local_8 + (long)in_RCX,
                           local_8,0);
    }
    else {
      local_8 = (HUF_DTable *)0xffffffffffffffb8;
    }
  }
  return (size_t)local_8;
}

Assistant:

size_t HUF_decompress1X1_DCtx_wksp(HUF_DTable* dctx, void* dst, size_t dstSize, const void* cSrc, size_t cSrcSize, void* workSpace, size_t wkspSize, int flags)
{
    const BYTE* ip = (const BYTE*) cSrc;

    size_t const hSize = HUF_readDTableX1_wksp(dctx, cSrc, cSrcSize, workSpace, wkspSize, flags);
    if (HUF_isError(hSize)) return hSize;
    if (hSize >= cSrcSize) return ERROR(srcSize_wrong);
    ip += hSize; cSrcSize -= hSize;

    return HUF_decompress1X1_usingDTable_internal(dst, dstSize, ip, cSrcSize, dctx, flags);
}